

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3ExprListFlags(ExprList *pList)

{
  Expr *pExpr;
  u32 m;
  int i;
  ExprList *pList_local;
  
  pExpr._0_4_ = 0;
  for (pExpr._4_4_ = 0; pExpr._4_4_ < pList->nExpr; pExpr._4_4_ = pExpr._4_4_ + 1) {
    pExpr._0_4_ = (pList->a[pExpr._4_4_].pExpr)->flags | (uint)pExpr;
  }
  return (uint)pExpr;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3ExprListFlags(const ExprList *pList){
  int i;
  u32 m = 0;
  assert( pList!=0 );
  for(i=0; i<pList->nExpr; i++){
     Expr *pExpr = pList->a[i].pExpr;
     assert( pExpr!=0 );
     m |= pExpr->flags;
  }
  return m;
}